

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::CommonEdgeCase::init
          (CommonEdgeCase *this,EVP_PKEY_CTX *ctx)

{
  size_type *psVar1;
  size_type *psVar2;
  deInt32 *pdVar3;
  Context *pCVar4;
  RenderContext *renderCtx;
  SharedPtrStateBase *pSVar5;
  bool bVar6;
  RenderTarget *pRVar7;
  long *plVar8;
  undefined8 *puVar9;
  ShaderProgram *this_00;
  SharedPtrStateBase *pSVar10;
  ContextInfo *extraout_RAX;
  ContextInfo *pCVar11;
  TestError *this_01;
  undefined8 uVar12;
  _Base_ptr p_Var13;
  pointer pbVar14;
  size_type *psVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  ulong *puVar17;
  Context *pCVar18;
  char *pcVar19;
  char *pcVar20;
  TestContext *pTVar21;
  _func_int **pp_Var22;
  undefined1 usePointMode;
  deInt32 *pdVar23;
  char *pcVar24;
  long lVar25;
  char *pcVar26;
  string fragmentShaderTemplate;
  string tessellationEvaluationTemplate;
  string tessellationControlTemplate;
  string vertexShaderTemplate;
  Context *local_2e0;
  long local_2d8;
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [32];
  string local_2a0;
  size_type *local_280;
  value_type local_278;
  Context *local_258;
  long local_250;
  undefined1 local_248 [16];
  undefined1 local_238 [32];
  pointer local_218;
  undefined1 local_210 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_200;
  size_type *local_1f0;
  value_type local_1e8;
  _Base_ptr local_1c8;
  undefined1 local_1c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1b0;
  string local_1a0;
  Context *local_180;
  long local_178;
  undefined1 local_170 [16];
  ContextInfo *local_160;
  undefined1 local_150 [40];
  long lStack_128;
  pointer local_120;
  undefined1 local_118 [9];
  undefined7 uStack_10f;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  undefined1 uStack_40;
  undefined8 uStack_3f;
  
  checkTessellationSupport((this->super_TestCase).m_context);
  if (this->m_caseType == CASETYPE_PRECISE) {
    checkGPUShader5Support((this->super_TestCase).m_context);
  }
  pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
  checkRenderTargetSize
            ((Functional *)(ulong)(uint)pRVar7->m_width,
             (RenderTarget *)(ulong)(uint)pRVar7->m_height,0x100);
  local_160 = (ContextInfo *)local_150;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_160,
             "${GLSL_VERSION_DECL}\n\nin highp vec2 in_v_position;\nin highp float in_v_tessParam;\n\nout highp vec2 in_tc_position;\nout highp float in_tc_tessParam;\n\nvoid main (void)\n{\n\tin_tc_position = in_v_position;\n\tin_tc_tessParam = in_v_tessParam;\n}\n"
             ,"");
  pcVar26 = "${GPU_SHADER5_REQUIRE}\n";
  pcVar24 = "";
  pcVar20 = "";
  if (this->m_caseType == CASETYPE_PRECISE) {
    pcVar20 = "${GPU_SHADER5_REQUIRE}\n";
  }
  local_2c0._0_8_ = local_2c0 + 0x10;
  pcVar19 = pcVar20 + 0x17;
  if (this->m_caseType != CASETYPE_PRECISE) {
    pcVar19 = pcVar20;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,pcVar20,pcVar19);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)local_2c0,0,(char *)0x0,0x1c3b308);
  local_2e0 = (Context *)local_2d0;
  pCVar18 = (Context *)(plVar8 + 2);
  if ((Context *)*plVar8 == pCVar18) {
    local_2d0._0_8_ = pCVar18->m_testCtx;
    local_2d0._8_8_ = plVar8[3];
  }
  else {
    local_2d0._0_8_ = pCVar18->m_testCtx;
    local_2e0 = (Context *)*plVar8;
  }
  local_2d8 = plVar8[1];
  *plVar8 = (long)pCVar18;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_2e0);
  pCVar18 = (Context *)(plVar8 + 2);
  if ((Context *)*plVar8 == pCVar18) {
    local_248._0_8_ = pCVar18->m_testCtx;
    local_248._8_8_ = plVar8[3];
    local_258 = (Context *)local_248;
  }
  else {
    local_248._0_8_ = pCVar18->m_testCtx;
    local_258 = (Context *)*plVar8;
  }
  local_250 = plVar8[1];
  *plVar8 = (long)pCVar18;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  pcVar20 = "4";
  if (this->m_primitiveType != TESSPRIMITIVETYPE_QUADS) {
    pcVar20 = (char *)0x0;
  }
  pcVar19 = "3";
  if (this->m_primitiveType != TESSPRIMITIVETYPE_TRIANGLES) {
    pcVar19 = pcVar20;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,pcVar19,(allocator<char> *)&local_1a0);
  pTVar21 = (TestContext *)0xf;
  if (local_258 != (Context *)local_248) {
    pTVar21 = (TestContext *)local_248._0_8_;
  }
  if (pTVar21 < (TestContext *)(local_2a0._M_string_length + local_250)) {
    uVar12 = (TestContext *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      uVar12 = local_2a0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < (TestContext *)(local_2a0._M_string_length + local_250)) goto LAB_014053a8;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_2a0,0,(char *)0x0,(ulong)local_258);
  }
  else {
LAB_014053a8:
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_2a0._M_dataplus._M_p);
  }
  local_280 = &local_278._M_string_length;
  psVar1 = puVar9 + 2;
  if ((size_type *)*puVar9 == psVar1) {
    local_278._M_string_length = *psVar1;
    local_278.field_2._M_allocated_capacity = puVar9[3];
  }
  else {
    local_278._M_string_length = *psVar1;
    local_280 = (size_type *)*puVar9;
  }
  local_278._M_dataplus._M_p = (pointer)puVar9[1];
  *puVar9 = psVar1;
  puVar9[1] = 0;
  *(undefined1 *)psVar1 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_280);
  p_Var13 = (_Base_ptr)(plVar8 + 2);
  if ((_Base_ptr)*plVar8 == p_Var13) {
    local_1c0._8_8_ = *(undefined8 *)p_Var13;
    aStack_1b0._M_allocated_capacity = plVar8[3];
    local_1c8 = (_Base_ptr)(local_1c0 + 8);
  }
  else {
    local_1c0._8_8_ = *(undefined8 *)p_Var13;
    local_1c8 = (_Base_ptr)*plVar8;
  }
  local_1c0._0_8_ = plVar8[1];
  *plVar8 = (long)p_Var13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_1c8);
  local_218 = (pointer)(local_210 + 8);
  pbVar14 = (pointer)(plVar8 + 2);
  if ((pointer)*plVar8 == pbVar14) {
    local_210._8_8_ = (pbVar14->_M_dataplus)._M_p;
    aStack_200._M_allocated_capacity = plVar8[3];
  }
  else {
    local_210._8_8_ = (pbVar14->_M_dataplus)._M_p;
    local_218 = (pointer)*plVar8;
  }
  local_210._0_8_ = plVar8[1];
  *plVar8 = (long)pbVar14;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_218);
  psVar1 = &local_1e8._M_string_length;
  psVar15 = (size_type *)(plVar8 + 2);
  if ((size_type *)*plVar8 == psVar15) {
    local_1e8._M_string_length = *psVar15;
    local_1e8.field_2._M_allocated_capacity = plVar8[3];
    local_1f0 = psVar1;
  }
  else {
    local_1e8._M_string_length = *psVar15;
    local_1f0 = (size_type *)*plVar8;
  }
  local_1e8._M_dataplus._M_p = (pointer)plVar8[1];
  *plVar8 = (long)psVar15;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_1f0);
  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 == paVar16) {
    local_f0[0]._0_8_ = paVar16->_M_allocated_capacity;
    local_f0[0]._8_8_ = puVar9[3];
    local_100._M_allocated_capacity = (size_type)local_f0;
  }
  else {
    local_f0[0]._0_8_ = paVar16->_M_allocated_capacity;
    local_100._M_allocated_capacity =
         (size_type)
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*puVar9;
  }
  local_100._8_8_ = puVar9[1];
  *puVar9 = paVar16;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append(local_100._M_local_buf);
  local_180 = (Context *)local_170;
  pCVar18 = (Context *)(plVar8 + 2);
  if ((Context *)*plVar8 == pCVar18) {
    local_170._0_8_ = pCVar18->m_testCtx;
    local_170._8_8_ = plVar8[3];
  }
  else {
    local_170._0_8_ = pCVar18->m_testCtx;
    local_180 = (Context *)*plVar8;
  }
  local_178 = plVar8[1];
  *plVar8 = (long)pCVar18;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_allocated_capacity != local_f0) {
    operator_delete((void *)local_100._M_allocated_capacity,local_f0[0]._M_allocated_capacity + 1);
  }
  if (local_1f0 != psVar1) {
    operator_delete(local_1f0,local_1e8._M_string_length + 1);
  }
  if (local_218 != (pointer)(local_210 + 8)) {
    operator_delete(local_218,(ulong)(local_210._8_8_ + 1));
  }
  if (local_1c8 != (_Base_ptr)(local_1c0 + 8)) {
    operator_delete(local_1c8,local_1c0._8_8_ + 1);
  }
  psVar15 = &local_278._M_string_length;
  if (local_280 != psVar15) {
    operator_delete(local_280,local_278._M_string_length + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if (local_258 != (Context *)local_248) {
    operator_delete(local_258,(ulong)((long)(Platform **)local_248._0_8_ + 1));
  }
  if (local_2e0 != (Context *)local_2d0) {
    operator_delete(local_2e0,(ulong)((long)(Platform **)local_2d0._0_8_ + 1));
  }
  if ((ContextInfo *)local_2c0._0_8_ != (ContextInfo *)(local_2c0 + 0x10)) {
    operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
  }
  if (this->m_caseType != CASETYPE_PRECISE) {
    pcVar26 = "";
  }
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  pcVar20 = pcVar26 + 0x17;
  if (this->m_caseType != CASETYPE_PRECISE) {
    pcVar20 = pcVar26;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,pcVar26,pcVar20);
  usePointMode = 0x34;
  plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_2a0,0,(char *)0x0,0x1c3b308);
  local_2c0._0_8_ = local_2c0 + 0x10;
  pCVar11 = (ContextInfo *)(plVar8 + 2);
  if ((ContextInfo *)*plVar8 == pCVar11) {
    local_2c0._16_8_ = pCVar11->_vptr_ContextInfo;
    local_2c0._24_8_ = plVar8[3];
  }
  else {
    local_2c0._16_8_ = pCVar11->_vptr_ContextInfo;
    local_2c0._0_8_ = (ContextInfo *)*plVar8;
  }
  local_2c0._8_8_ = plVar8[1];
  *plVar8 = (long)pCVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append(local_2c0);
  pCVar18 = (Context *)(plVar8 + 2);
  if ((Context *)*plVar8 == pCVar18) {
    local_2d0._0_8_ = pCVar18->m_testCtx;
    local_2d0._8_8_ = plVar8[3];
    local_2e0 = (Context *)local_2d0;
  }
  else {
    local_2d0._0_8_ = pCVar18->m_testCtx;
    local_2e0 = (Context *)*plVar8;
  }
  local_2d8 = plVar8[1];
  *plVar8 = (long)pCVar18;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  Functional::(anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
            (&local_1a0,(_anonymous_namespace_ *)(ulong)this->m_primitiveType,this->m_spacing,
             SPACINGMODE_EQUAL,(bool)usePointMode);
  pTVar21 = (TestContext *)0xf;
  if (local_2e0 != (Context *)local_2d0) {
    pTVar21 = (TestContext *)local_2d0._0_8_;
  }
  if (pTVar21 < (TestContext *)(local_1a0._M_string_length + local_2d8)) {
    uVar12 = (TestContext *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      uVar12 = local_1a0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < (TestContext *)(local_1a0._M_string_length + local_2d8)) goto LAB_01405873;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1a0,0,(char *)0x0,(ulong)local_2e0);
  }
  else {
LAB_01405873:
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_1a0._M_dataplus._M_p);
  }
  psVar2 = puVar9 + 2;
  if ((size_type *)*puVar9 == psVar2) {
    local_278._M_string_length = *psVar2;
    local_278.field_2._M_allocated_capacity = puVar9[3];
    local_280 = psVar15;
  }
  else {
    local_278._M_string_length = *psVar2;
    local_280 = (size_type *)*puVar9;
  }
  local_278._M_dataplus._M_p = (pointer)puVar9[1];
  *puVar9 = psVar2;
  puVar9[1] = 0;
  *(undefined1 *)psVar2 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_280);
  local_1c8 = (_Base_ptr)(local_1c0 + 8);
  p_Var13 = (_Base_ptr)(plVar8 + 2);
  if ((_Base_ptr)*plVar8 == p_Var13) {
    local_1c0._8_8_ = *(undefined8 *)p_Var13;
    aStack_1b0._M_allocated_capacity = plVar8[3];
  }
  else {
    local_1c0._8_8_ = *(undefined8 *)p_Var13;
    local_1c8 = (_Base_ptr)*plVar8;
  }
  local_1c0._0_8_ = plVar8[1];
  *plVar8 = (long)p_Var13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if (this->m_caseType == CASETYPE_PRECISE) {
    pcVar24 = "precise gl_Position;\n\n";
  }
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_1c8);
  local_218 = (pointer)(local_210 + 8);
  pbVar14 = (pointer)(plVar8 + 2);
  if ((pointer)*plVar8 == pbVar14) {
    local_210._8_8_ = (pbVar14->_M_dataplus)._M_p;
    aStack_200._M_allocated_capacity = plVar8[3];
  }
  else {
    local_210._8_8_ = (pbVar14->_M_dataplus)._M_p;
    local_218 = (pointer)*plVar8;
  }
  local_210._0_8_ = plVar8[1];
  *plVar8 = (long)pbVar14;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_218);
  puVar17 = (ulong *)(plVar8 + 2);
  if ((size_type *)*plVar8 == puVar17) {
    local_1e8._M_string_length = *puVar17;
    local_1e8.field_2._M_allocated_capacity = plVar8[3];
    local_1f0 = psVar1;
  }
  else {
    local_1e8._M_string_length = *puVar17;
    local_1f0 = (size_type *)*plVar8;
  }
  local_1e8._M_dataplus._M_p = (pointer)plVar8[1];
  *plVar8 = (long)puVar17;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if (this->m_primitiveType == TESSPRIMITIVETYPE_QUADS) {
    local_120 = (pointer)(local_118 + 8);
    local_118._0_8_ = 0;
    local_118[8] = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_150._16_8_ = local_150 + 0x20;
    pCVar11 = (ContextInfo *)(plVar8 + 2);
    if ((ContextInfo *)*plVar8 == pCVar11) {
      local_150._32_8_ = pCVar11->_vptr_ContextInfo;
      lStack_128 = plVar8[3];
    }
    else {
      local_150._32_8_ = pCVar11->_vptr_ContextInfo;
      local_150._16_8_ = (ContextInfo *)*plVar8;
    }
    local_150._24_8_ = plVar8[1];
    *plVar8 = (long)pCVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append(local_150 + 0x10);
    local_238._0_8_ = local_238 + 0x10;
    pCVar11 = (ContextInfo *)(plVar8 + 2);
    if ((ContextInfo *)*plVar8 == pCVar11) {
      local_238._16_8_ = pCVar11->_vptr_ContextInfo;
      local_238._24_8_ = plVar8[3];
    }
    else {
      local_238._16_8_ = pCVar11->_vptr_ContextInfo;
      local_238._0_8_ = (ContextInfo *)*plVar8;
    }
    local_238._8_8_ = plVar8[1];
    *plVar8 = (long)pCVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    bVar6 = true;
  }
  else {
    local_238._0_8_ = local_238 + 0x10;
    if (this->m_primitiveType != TESSPRIMITIVETYPE_TRIANGLES) {
      uVar12 = std::__throw_logic_error("basic_string::_M_construct null not valid");
      __cxa_free_exception(pcVar24);
      if (local_2e0 != (Context *)local_2d0) {
        operator_delete(local_2e0,(ulong)((long)(Platform **)local_2d0._0_8_ + 1));
      }
      if (local_258 != (Context *)local_248) {
        operator_delete(local_258,(ulong)((long)(Platform **)local_248._0_8_ + 1));
      }
      if (local_180 != (Context *)local_170) {
        operator_delete(local_180,(ulong)((long)(Platform **)local_170._0_8_ + 1));
      }
      if (local_160 != (ContextInfo *)local_150) {
        operator_delete(local_160,(ulong)((long)(Platform **)local_150._0_8_ + 1));
      }
      _Unwind_Resume(uVar12);
    }
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_238,
               "\thighp vec2 pos = gl_TessCoord.x*in_te_position[0] + gl_TessCoord.y*in_te_position[1] + gl_TessCoord.z*in_te_position[2];\n\n\thighp float f = sqrt(3.0 * min(gl_TessCoord.x, min(gl_TessCoord.y, gl_TessCoord.z))) * 0.5 + 0.5;\n\tin_f_color = vec4(gl_TessCoord*f, 1.0);\n"
               ,"");
    bVar6 = false;
  }
  pp_Var22 = (_func_int **)0xf;
  if (local_1f0 != psVar1) {
    pp_Var22 = (_func_int **)local_1e8._M_string_length;
  }
  if (pp_Var22 < local_1e8._M_dataplus._M_p + local_238._8_8_) {
    pp_Var22 = (_func_int **)0xf;
    if ((ContextInfo *)local_238._0_8_ != (ContextInfo *)(local_238 + 0x10)) {
      pp_Var22 = (_func_int **)local_238._16_8_;
    }
    if (local_1e8._M_dataplus._M_p + local_238._8_8_ <= pp_Var22) {
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)local_238,0,(char *)0x0,(ulong)local_1f0);
      goto LAB_01405bbd;
    }
  }
  puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1f0,local_238._0_8_);
LAB_01405bbd:
  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 == paVar16) {
    local_f0[0]._0_8_ = paVar16->_M_allocated_capacity;
    local_f0[0]._8_8_ = puVar9[3];
    local_100._M_allocated_capacity = (size_type)local_f0;
  }
  else {
    local_f0[0]._0_8_ = paVar16->_M_allocated_capacity;
    local_100._M_allocated_capacity =
         (size_type)
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*puVar9;
  }
  local_100._8_8_ = puVar9[1];
  *puVar9 = paVar16;
  puVar9[1] = 0;
  paVar16->_M_local_buf[0] = '\0';
  plVar8 = (long *)std::__cxx11::string::append(local_100._M_local_buf);
  local_258 = (Context *)local_248;
  pCVar18 = (Context *)(plVar8 + 2);
  if ((Context *)*plVar8 == pCVar18) {
    local_248._0_8_ = pCVar18->m_testCtx;
    local_248._8_8_ = plVar8[3];
  }
  else {
    local_248._0_8_ = pCVar18->m_testCtx;
    local_258 = (Context *)*plVar8;
  }
  local_250 = plVar8[1];
  *plVar8 = (long)pCVar18;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_allocated_capacity != local_f0) {
    operator_delete((void *)local_100._M_allocated_capacity,local_f0[0]._M_allocated_capacity + 1);
  }
  if ((ContextInfo *)local_238._0_8_ != (ContextInfo *)(local_238 + 0x10)) {
    operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
  }
  if (bVar6) {
    if ((ContextInfo *)local_150._16_8_ != (ContextInfo *)(local_150 + 0x20)) {
      operator_delete((void *)local_150._16_8_,
                      (ulong)((long)&((_Alloc_hider *)local_150._32_8_)->_M_p + 1));
    }
    if (local_120 != (pointer)(local_118 + 8)) {
      operator_delete(local_120,CONCAT71(uStack_10f,local_118[8]) + 1);
    }
  }
  if (local_1f0 != psVar1) {
    operator_delete(local_1f0,local_1e8._M_string_length + 1);
  }
  if (local_218 != (pointer)(local_210 + 8)) {
    operator_delete(local_218,(ulong)(local_210._8_8_ + 1));
  }
  if (local_1c8 != (_Base_ptr)(local_1c0 + 8)) {
    operator_delete(local_1c8,local_1c0._8_8_ + 1);
  }
  if (local_280 != psVar15) {
    operator_delete(local_280,local_278._M_string_length + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,(ulong)(local_1a0.field_2._M_allocated_capacity + 1))
    ;
  }
  if (local_2e0 != (Context *)local_2d0) {
    operator_delete(local_2e0,(ulong)((long)(Platform **)local_2d0._0_8_ + 1));
  }
  if ((ContextInfo *)local_2c0._0_8_ != (ContextInfo *)(local_2c0 + 0x10)) {
    operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  local_2e0 = (Context *)local_2d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2e0,
             "${GLSL_VERSION_DECL}\n\nlayout (location = 0) out mediump vec4 o_color;\n\nin mediump vec4 in_f_color;\n\nvoid main (void)\n{\n\to_color = in_f_color;\n}\n"
             ,"");
  this_00 = (ShaderProgram *)operator_new(0xd0);
  pCVar4 = (this->super_TestCase).m_context;
  renderCtx = pCVar4->m_renderCtx;
  memset(&local_100,0,0xac);
  local_50._M_allocated_capacity = 0;
  local_50._M_local_buf[8] = '\0';
  local_50._9_7_ = 0;
  uStack_40 = 0;
  uStack_3f = 0;
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            ((string *)local_2c0,(_anonymous_namespace_ *)pCVar4->m_renderCtx,(Context *)local_160,
             (char *)pCVar18);
  local_1f0 = (size_type *)((ulong)local_1f0 & 0xffffffff00000000);
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,local_2c0._0_8_,(pointer)(local_2c0._0_8_ + local_2c0._8_8_));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_100 + ((ulong)local_1f0 & 0xffffffff) * 0x18),&local_1e8);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_2a0,(_anonymous_namespace_ *)((this->super_TestCase).m_context)->m_renderCtx,
             local_180,(char *)pCVar18);
  local_218 = (pointer)CONCAT44(local_218._4_4_,3);
  local_210._0_8_ = &aStack_200;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_210,local_2a0._M_dataplus._M_p,
             local_2a0._M_dataplus._M_p + local_2a0._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_100 + ((ulong)local_218 & 0xffffffff) * 0x18),(value_type *)local_210
             );
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_1a0,(_anonymous_namespace_ *)((this->super_TestCase).m_context)->m_renderCtx,
             local_258,(char *)pCVar18);
  local_1c8 = (_Base_ptr)CONCAT44(local_1c8._4_4_,4);
  local_1c0._0_8_ = &aStack_1b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1c0,local_1a0._M_dataplus._M_p,
             local_1a0._M_dataplus._M_p + local_1a0._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_100 + ((ulong)local_1c8 & 0xffffffff) * 0x18),(value_type *)local_1c0
             );
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            ((string *)local_238,
             (_anonymous_namespace_ *)((this->super_TestCase).m_context)->m_renderCtx,local_2e0,
             (char *)pCVar18);
  local_280 = (size_type *)CONCAT44(local_280._4_4_,1);
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_278,local_238._0_8_,(pointer)(local_238._0_8_ + local_238._8_8_));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_100 + ((ulong)local_280 & 0xffffffff) * 0x18),&local_278);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,(ProgramSources *)&local_100);
  pSVar10 = (SharedPtrStateBase *)operator_new(0x20);
  pdVar3 = &pSVar10->strongRefCount;
  pSVar10->strongRefCount = 0;
  pSVar10->weakRefCount = 0;
  pSVar10->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0212cb98;
  pSVar10[1]._vptr_SharedPtrStateBase = (_func_int **)this_00;
  pSVar10->strongRefCount = 1;
  pSVar10->weakRefCount = 1;
  pSVar5 = (this->m_program).m_state;
  if (pSVar5 != pSVar10) {
    if (pSVar5 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar23 = &pSVar5->strongRefCount;
      *pdVar23 = *pdVar23 + -1;
      UNLOCK();
      if (*pdVar23 == 0) {
        (this->m_program).m_ptr = (ShaderProgram *)0x0;
        (*((this->m_program).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar23 = &((this->m_program).m_state)->weakRefCount;
      *pdVar23 = *pdVar23 + -1;
      UNLOCK();
      if (*pdVar23 == 0) {
        pSVar5 = (this->m_program).m_state;
        if (pSVar5 != (SharedPtrStateBase *)0x0) {
          (*pSVar5->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_program).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_program).m_ptr = this_00;
    (this->m_program).m_state = pSVar10;
    LOCK();
    pSVar10->strongRefCount = pSVar10->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar23 = &((this->m_program).m_state)->weakRefCount;
    *pdVar23 = *pdVar23 + 1;
    UNLOCK();
  }
  pdVar23 = &pSVar10->weakRefCount;
  LOCK();
  *pdVar3 = *pdVar3 + -1;
  UNLOCK();
  if (*pdVar3 == 0) {
    (*pSVar10->_vptr_SharedPtrStateBase[2])(pSVar10);
  }
  LOCK();
  *pdVar23 = *pdVar23 + -1;
  UNLOCK();
  if (*pdVar23 == 0) {
    (*pSVar10->_vptr_SharedPtrStateBase[1])(pSVar10);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((ContextInfo *)local_238._0_8_ != (ContextInfo *)(local_238 + 0x10)) {
    operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._0_8_ != &aStack_1b0) {
    operator_delete((void *)local_1c0._0_8_,aStack_1b0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,(ulong)(local_1a0.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._0_8_ != &aStack_200) {
    operator_delete((void *)local_210._0_8_,aStack_200._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((ContextInfo *)local_2c0._0_8_ != (ContextInfo *)(local_2c0 + 0x10)) {
    operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_50);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            ((vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
             local_70);
  lVar25 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_100 + lVar25));
    lVar25 = lVar25 + -0x18;
  } while (lVar25 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (this->m_program).m_ptr);
  if ((((this->m_program).m_ptr)->m_program).m_info.linkOk != false) {
    if (local_2e0 != (Context *)local_2d0) {
      operator_delete(local_2e0,(ulong)((long)(Platform **)local_2d0._0_8_ + 1));
    }
    if (local_258 != (Context *)local_248) {
      operator_delete(local_258,(ulong)((long)(Platform **)local_248._0_8_ + 1));
    }
    if (local_180 != (Context *)local_170) {
      operator_delete(local_180,(ulong)((long)(Platform **)local_170._0_8_ + 1));
    }
    pCVar11 = (ContextInfo *)local_150;
    if (local_160 != pCVar11) {
      operator_delete(local_160,(ulong)((long)(Platform **)local_150._0_8_ + 1));
      pCVar11 = extraout_RAX;
    }
    return (int)pCVar11;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Program compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
             ,0x6b1);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void CommonEdgeCase::init (void)
{
	checkTessellationSupport(m_context);

	if (m_caseType == CASETYPE_PRECISE)
		checkGPUShader5Support(m_context);

	checkRenderTargetSize(m_context.getRenderTarget(), RENDER_SIZE);

	std::string vertexShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "in highp vec2 in_v_position;\n"
													 "in highp float in_v_tessParam;\n"
													 "\n"
													 "out highp vec2 in_tc_position;\n"
													 "out highp float in_tc_tessParam;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	in_tc_position = in_v_position;\n"
													 "	in_tc_tessParam = in_v_tessParam;\n"
												 "}\n");

	std::string tessellationControlTemplate		("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
												 + string(m_caseType == CASETYPE_PRECISE ? "${GPU_SHADER5_REQUIRE}\n" : "") +
													 "\n"
													 "layout (vertices = " + string(m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? "3" : m_primitiveType == TESSPRIMITIVETYPE_QUADS ? "4" : DE_NULL) + ") out;\n"
													 "\n"
													 "in highp vec2 in_tc_position[];\n"
													 "in highp float in_tc_tessParam[];\n"
													 "\n"
													 "out highp vec2 in_te_position[];\n"
													 "\n"
													 + (m_caseType == CASETYPE_PRECISE ? "precise gl_TessLevelOuter;\n\n" : "") +
													 "void main (void)\n"
													 "{\n"
													 "	in_te_position[gl_InvocationID] = in_tc_position[gl_InvocationID];\n"
													 "\n"
													 "	gl_TessLevelInner[0] = 5.0;\n"
													 "	gl_TessLevelInner[1] = 5.0;\n"
													 "\n"
													 + (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ?
														"	gl_TessLevelOuter[0] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[1] + in_tc_tessParam[2]);\n"
														"	gl_TessLevelOuter[1] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[2] + in_tc_tessParam[0]);\n"
														"	gl_TessLevelOuter[2] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[0] + in_tc_tessParam[1]);\n"
													  : m_primitiveType == TESSPRIMITIVETYPE_QUADS ?
														"	gl_TessLevelOuter[0] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[0] + in_tc_tessParam[2]);\n"
														"	gl_TessLevelOuter[1] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[1] + in_tc_tessParam[0]);\n"
														"	gl_TessLevelOuter[2] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[3] + in_tc_tessParam[1]);\n"
														"	gl_TessLevelOuter[3] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[2] + in_tc_tessParam[3]);\n"
													  : DE_NULL) +
												 "}\n");

	std::string tessellationEvaluationTemplate	("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
												 + string(m_caseType == CASETYPE_PRECISE ? "${GPU_SHADER5_REQUIRE}\n" : "") +
													 "\n"
													 + getTessellationEvaluationInLayoutString(m_primitiveType, m_spacing) +
													 "\n"
													 "in highp vec2 in_te_position[];\n"
													 "\n"
													 "out mediump vec4 in_f_color;\n"
													 "\n"
													 + (m_caseType == CASETYPE_PRECISE ? "precise gl_Position;\n\n" : "") +
													 "void main (void)\n"
													 "{\n"
													 + (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ?
														"	highp vec2 pos = gl_TessCoord.x*in_te_position[0] + gl_TessCoord.y*in_te_position[1] + gl_TessCoord.z*in_te_position[2];\n"
														"\n"
														"	highp float f = sqrt(3.0 * min(gl_TessCoord.x, min(gl_TessCoord.y, gl_TessCoord.z))) * 0.5 + 0.5;\n"
														"	in_f_color = vec4(gl_TessCoord*f, 1.0);\n"
													  : m_primitiveType == TESSPRIMITIVETYPE_QUADS ?
													    string()
														+ (m_caseType == CASETYPE_BASIC ?
															"	highp vec2 pos = (1.0-gl_TessCoord.x)*(1.0-gl_TessCoord.y)*in_te_position[0]\n"
															"	               + (    gl_TessCoord.x)*(1.0-gl_TessCoord.y)*in_te_position[1]\n"
															"	               + (1.0-gl_TessCoord.x)*(    gl_TessCoord.y)*in_te_position[2]\n"
															"	               + (    gl_TessCoord.x)*(    gl_TessCoord.y)*in_te_position[3];\n"
														 : m_caseType == CASETYPE_PRECISE ?
															"	highp vec2 a = (1.0-gl_TessCoord.x)*(1.0-gl_TessCoord.y)*in_te_position[0];\n"
															"	highp vec2 b = (    gl_TessCoord.x)*(1.0-gl_TessCoord.y)*in_te_position[1];\n"
															"	highp vec2 c = (1.0-gl_TessCoord.x)*(    gl_TessCoord.y)*in_te_position[2];\n"
															"	highp vec2 d = (    gl_TessCoord.x)*(    gl_TessCoord.y)*in_te_position[3];\n"
															"	highp vec2 pos = a+b+c+d;\n"
														 : DE_NULL) +
														"\n"
														"	highp float f = sqrt(1.0 - 2.0 * max(abs(gl_TessCoord.x - 0.5), abs(gl_TessCoord.y - 0.5)))*0.5 + 0.5;\n"
														"	in_f_color = vec4(0.1, gl_TessCoord.xy*f, 1.0);\n"
													  : DE_NULL) +
													 "\n"
													 "	// Offset the position slightly, based on the parity of the bits in the float representation.\n"
													 "	// This is done to detect possible small differences in edge vertex positions between patches.\n"
													 "	uvec2 bits = floatBitsToUint(pos);\n"
													 "	uint numBits = 0u;\n"
													 "	for (uint i = 0u; i < 32u; i++)\n"
													 "		numBits += ((bits[0] >> i) & 1u) + ((bits[1] >> i) & 1u);\n"
													 "	pos += float(numBits&1u)*0.04;\n"
													 "\n"
													 "	gl_Position = vec4(pos, 0.0, 1.0);\n"
												 "}\n");

	std::string fragmentShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "layout (location = 0) out mediump vec4 o_color;\n"
													 "\n"
													 "in mediump vec4 in_f_color;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	o_color = in_f_color;\n"
												 "}\n");

	m_program = SharedPtr<const ShaderProgram>(new ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
			<< glu::VertexSource					(specializeShader(m_context, vertexShaderTemplate.c_str()))
			<< glu::TessellationControlSource		(specializeShader(m_context, tessellationControlTemplate.c_str()))
			<< glu::TessellationEvaluationSource	(specializeShader(m_context, tessellationEvaluationTemplate.c_str()))
			<< glu::FragmentSource					(specializeShader(m_context, fragmentShaderTemplate.c_str()))));

	m_testCtx.getLog() << *m_program;
	if (!m_program->isOk())
		TCU_FAIL("Program compilation failed");
}